

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string __thiscall mjs::operator+(mjs *this,string *l,string *r)

{
  gc_heap *h;
  undefined8 extraout_RDX;
  string sVar1;
  allocator<wchar_t> local_c9;
  wstring_view local_c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  allocator<wchar_t> local_81;
  wstring_view local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  wstring_view local_30;
  string *local_20;
  string *r_local;
  string *l_local;
  
  local_20 = r;
  r_local = l;
  l_local = (string *)this;
  h = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)l);
  local_80 = string::view(r_local);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_70,&local_80,&local_81);
  local_c8 = string::view(local_20);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_b8,&local_c8,&local_c9);
  std::operator+(&local_50,&local_70,&local_b8);
  local_30 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_50);
  string::string((string *)this,h,&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::allocator<wchar_t>::~allocator(&local_c9);
  std::__cxx11::wstring::~wstring((wstring *)&local_70);
  std::allocator<wchar_t>::~allocator(&local_81);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

inline string operator+(const string& l, const string& r) {
    // TODO: Optimize this
    return string{l.heap(), std::wstring{l.view()} + std::wstring{r.view()}};
}